

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

void buf_grow(SBuf *sb,MSize sz)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  uint in_ESI;
  int *in_RDI;
  char *b;
  MSize nsz;
  MSize len;
  MSize osz;
  undefined8 in_stack_ffffffffffffffe0;
  uint uVar5;
  
  uVar1 = in_RDI[1] - in_RDI[2];
  iVar2 = *in_RDI - in_RDI[2];
  uVar5 = uVar1;
  if (uVar1 < 0x20) {
    uVar5 = 0x20;
  }
  for (; uVar5 < in_ESI; uVar5 = uVar5 * 2) {
  }
  pvVar3 = lj_mem_realloc((lua_State *)CONCAT44(in_ESI,uVar1),(void *)CONCAT44(iVar2,uVar5),
                          (GCSize)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                          (GCSize)in_stack_ffffffffffffffe0);
  iVar4 = (int)pvVar3;
  in_RDI[2] = iVar4;
  *in_RDI = iVar4 + iVar2;
  in_RDI[1] = iVar4 + uVar5;
  return;
}

Assistant:

static void buf_grow(SBuf *sb, MSize sz)
{
  MSize osz = sbufsz(sb), len = sbuflen(sb), nsz = osz;
  char *b;
  if (nsz < LJ_MIN_SBUF) nsz = LJ_MIN_SBUF;
  while (nsz < sz) nsz += nsz;
  b = (char *)lj_mem_realloc(sbufL(sb), sbufB(sb), osz, nsz);
  setmref(sb->b, b);
  setmref(sb->p, b + len);
  setmref(sb->e, b + nsz);
}